

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O3

void ngai_do_elem2_oper(Integer atype,Integer cndim,Integer *loC,Integer *hiC,Integer *ldC,
                       void *A_ptr,void *B_ptr,void *C_ptr,int op)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Integer baseldC [7];
  Integer bunit [7];
  long local_e8 [8];
  long local_a8 [8];
  undefined8 local_68;
  long lStack_60;
  undefined1 local_58 [40];
  
  lVar4 = 1;
  if (1 < cndim) {
    lVar2 = 1;
    do {
      lVar4 = lVar4 * ((hiC[lVar2] - loC[lVar2]) + 1);
      lVar2 = lVar2 + 1;
    } while (cndim != lVar2);
  }
  local_68 = 0;
  lStack_60 = 0;
  local_a8[0] = 1;
  local_a8[1] = 1;
  local_e8[0] = *ldC;
  lVar2 = *ldC * ldC[1];
  local_e8[1] = lVar2;
  if (2 < cndim) {
    memset(local_58,0,cndim * 8 - 0x10);
    lVar1 = 2;
    lVar3 = 1;
    do {
      lVar3 = lVar3 * ((hiC[lVar1 + -1] - loC[lVar1 + -1]) + 1);
      local_a8[lVar1] = lVar3;
      lVar2 = lVar2 * ldC[lVar1];
      local_e8[lVar1] = lVar2;
      lVar1 = lVar1 + 1;
    } while (cndim != lVar1);
  }
  if (0 < lVar4) {
    lVar2 = 0;
    do {
      if (1 < cndim) {
        lVar1 = 0;
        do {
          lVar5 = *(long *)(local_58 + lVar1 * 8 + -8) +
                  (ulong)((lVar2 + 1) % local_a8[lVar1 + 1] == 0);
          lVar3 = 0;
          if (lVar5 <= hiC[lVar1 + 1] - loC[lVar1 + 1]) {
            lVar3 = lVar5;
          }
          *(long *)(local_58 + lVar1 * 8 + -8) = lVar3;
          lVar1 = lVar1 + 1;
        } while (cndim + -1 != lVar1);
      }
      switch(atype) {
      case 0x3e9:
      case 0x3eb:
        break;
      case 0x3ea:
      case 0x3ec:
      case 0x3ee:
        break;
      default:
        pnga_error(" wrong data type ",atype);
        break;
      case 0x3ef:
      }
      if (op - 3U < 9) {
        (*(code *)(&DAT_001d503c + *(int *)(&DAT_001d503c + (ulong)(op - 3U) * 4)))();
        return;
      }
      printf("op : OP_ELEM_MULT = %d:%d\n",(ulong)(uint)op,3);
      pnga_error(" wrong operation ",(ulong)(uint)op);
      lVar2 = lVar2 + 1;
    } while (lVar2 != lVar4);
  }
  return;
}

Assistant:

static
void ngai_do_elem2_oper(Integer atype, Integer cndim, Integer *loC, Integer *hiC,
                        Integer *ldC, void *A_ptr, void *B_ptr, void *C_ptr, int op)
{
  Integer i, j;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldC[MAXDIM];
  void *tempA = NULL, *tempB = NULL, *tempC = NULL;
  Integer idx, n1dim;
  /* compute "local" operation accoording to op */

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<cndim; i++) n1dim *= (hiC[i] - loC[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldC[0] = ldC[0]; baseldC[1] = baseldC[0] *ldC[1];
  for(i=2; i<cndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiC[i-1] - loC[i-1] + 1);
    baseldC[i] = baseldC[i-1] * ldC[i];
  }


  for(i=0; i<n1dim; i++) {
    idx = 0;
    for(j=1; j<cndim; j++) {
      idx += bvalue[j] * baseldC[j-1];
      if(((i+1) % bunit[j]) == 0) bvalue[j]++;
      if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
    }

    switch(atype){
      case C_DBL:
        tempA=((double*)A_ptr)+idx;
        tempB=((double*)B_ptr)+idx;
        tempC=((double*)C_ptr)+idx;
        break;
      case C_DCPL:
        tempA=((DoubleComplex*)A_ptr)+idx;
        tempB=((DoubleComplex*)B_ptr)+idx;
        tempC=((DoubleComplex*)C_ptr)+idx;
        break;
      case C_SCPL:
        tempA=((SingleComplex*)A_ptr)+idx;
        tempB=((SingleComplex*)B_ptr)+idx;
        tempC=((SingleComplex*)C_ptr)+idx;
        break;
      case C_INT:
        tempA=((int*)A_ptr)+idx;
        tempB=((int*)B_ptr)+idx;
        tempC=((int*)C_ptr)+idx;
        break;
      case C_FLOAT:
        tempA=((float*)A_ptr)+idx;
        tempB=((float*)B_ptr)+idx;
        tempC=((float*)C_ptr)+idx;
        break;
      case C_LONG:
        tempA=((long *)A_ptr)+idx;
        tempB=((long *)B_ptr)+idx;
        tempC=((long *)C_ptr)+idx;
        break;

      default: pnga_error(" wrong data type ",atype);
    }   
    switch((int)op)
    {
      case OP_ELEM_MULT:
        do_multiply(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_ELEM_DIV:
        do_divide(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_ELEM_SDIV:
        do_step_divide(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_ELEM_SDIV2:
        do_stepb_divide(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_STEP_MASK:
        do_step_mask(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case  OP_ELEM_MAX:
        do_maximum(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case  OP_ELEM_MIN:
        do_minimum(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      default: 
        printf("op : OP_ELEM_MULT = %d:%d\n", op, OP_ELEM_MULT);
        pnga_error(" wrong operation ",op);
    }
  }
}